

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_response_parsing_smoke02_Test::TestBody(http_response_parsing_smoke02_Test *this)

{
  size_t *text;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  http_response response;
  sub_string str;
  http_response_parsing_smoke02_Test *this_local;
  
  join_0x00000010_0x00000000_ =
       sub_string::literal<903ul>
                 ((char (*) [903])
                  "HTTP/1.1 200 OK\r\nDate: Wed, 23 Dec 2015 13:43:56 GMT\r\nServer: Server\r\nSet-Cookie: skin=noskin; path=/; domain=.amazon.com\r\npragma: no-cache\r\nx-amz-id-1: 0WDRFNYP6K3XJ8VGHRBQ\r\np3p: policyref=\"https://www.amazon.com/w3c/p3p.xml\",CP=\"CAO DSP LAW CUR ADM IVAo IVDo CONo OTPo OUR DELi PUBi OTRi BUS PHY ONL UNI PUR FIN COM NAV INT DEM CNT STA HEA PRE LOC GOV OTC \"\r\ncache-control: no-cache\r\nx-frame-options: SAMEORIGIN\r\nexpires: -1\r\nVary: Accept-Encoding,User-Agent,Avail-Dictionary\r\nContent-Encoding: gzip\r\nContent-Type: text/html; charset=UTF-8\r\nSet-cookie: ubid-main=190-5441568-7691748; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT\r\nSet-cookie: session-id-time=2082787201l; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT\r\nSet-cookie: session-id=178-4697370-5690842; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT\r\nTransfer-Encoding: chunked\r\n\r\n"
                 );
  text = &response.headers._M_t._M_impl.super__Rb_tree_header._M_node_count;
  parse_response((http_response *)&gtest_ar_.message_,(sub_string *)text);
  bVar1 = sub_string::empty((sub_string *)text);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_78,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_78,(AssertionResult *)0x1870b9,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0xea,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  http_response::~http_response((http_response *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(http_response_parsing, smoke02)
{
    sub_string str = sub_string::literal(
        "HTTP/1.1 200 OK" "\r\n"
        "Date: Wed, 23 Dec 2015 13:43:56 GMT" "\r\n"
        "Server: Server" "\r\n"
        "Set-Cookie: skin=noskin; path=/; domain=.amazon.com" "\r\n"
        "pragma: no-cache" "\r\n"
        "x-amz-id-1: 0WDRFNYP6K3XJ8VGHRBQ" "\r\n"
        "p3p: policyref=\"https://www.amazon.com/w3c/p3p.xml\",CP=\"CAO DSP LAW CUR ADM IVAo IVDo CONo OTPo OUR DELi PUBi OTRi BUS PHY ONL UNI PUR FIN COM NAV INT DEM CNT STA HEA PRE LOC GOV OTC \"" "\r\n"
        "cache-control: no-cache" "\r\n"
        "x-frame-options: SAMEORIGIN" "\r\n"
        "expires: -1" "\r\n"
        "Vary: Accept-Encoding,User-Agent,Avail-Dictionary" "\r\n"
        "Content-Encoding: gzip" "\r\n"
        "Content-Type: text/html; charset=UTF-8" "\r\n"
        "Set-cookie: ubid-main=190-5441568-7691748; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Set-cookie: session-id-time=2082787201l; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Set-cookie: session-id=178-4697370-5690842; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Transfer-Encoding: chunked" "\r\n"
        "\r\n");
    http_response response = parse_response(str);
    EXPECT_TRUE(str.empty());
}